

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O2

void __thiscall Arena::Arena(Arena *this,void *base_in,size_t size_in,size_t alignment_in)

{
  _Rb_tree_header *p_Var1;
  void **__args_1;
  long in_FS_OFFSET;
  long local_48;
  iterator it;
  size_t size_in_local;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_Arena = (_func_int **)&PTR__Arena_001d4cc8;
  p_Var1 = &(this->size_to_free_chunk)._M_t._M_impl.super__Rb_tree_header;
  (this->size_to_free_chunk)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->size_to_free_chunk)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->size_to_free_chunk)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->size_to_free_chunk)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->size_to_free_chunk)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->chunks_free)._M_h._M_buckets = &(this->chunks_free)._M_h._M_single_bucket;
  (this->chunks_free)._M_h._M_bucket_count = 1;
  (this->chunks_free)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->chunks_free)._M_h._M_element_count = 0;
  (this->chunks_free)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->chunks_free)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->chunks_free)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->chunks_free_end)._M_h._M_buckets = &(this->chunks_free_end)._M_h._M_single_bucket;
  (this->chunks_free_end)._M_h._M_bucket_count = 1;
  (this->chunks_free_end)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->chunks_free_end)._M_h._M_element_count = 0;
  (this->chunks_free_end)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->chunks_free_end)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->chunks_free_end)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->chunks_used)._M_h._M_buckets = &(this->chunks_used)._M_h._M_single_bucket;
  (this->chunks_used)._M_h._M_bucket_count = 1;
  (this->chunks_used)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->chunks_used)._M_h._M_element_count = 0;
  (this->chunks_used)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->chunks_used)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->chunks_used)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __args_1 = &this->base;
  this->base = base_in;
  this->end = (void *)((long)base_in + size_in);
  this->alignment = alignment_in;
  size_in_local = size_in;
  it._M_node = (_Base_ptr)
               std::
               _Rb_tree<unsigned_long,std::pair<unsigned_long_const,void*>,std::_Select1st<std::pair<unsigned_long_const,void*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
               ::_M_emplace_equal<unsigned_long&,void*&>
                         ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,void*>,std::_Select1st<std::pair<unsigned_long_const,void*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
                           *)&this->size_to_free_chunk,&size_in_local,__args_1);
  std::
  _Hashtable<void*,std::pair<void*const,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,void*>>>,std::allocator<std::pair<void*const,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,void*>>>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<void*&,std::_Rb_tree_iterator<std::pair<unsigned_long_const,void*>>&>
            ((_Hashtable<void*,std::pair<void*const,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,void*>>>,std::allocator<std::pair<void*const,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,void*>>>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->chunks_free,__args_1);
  local_48 = (long)*__args_1 + size_in_local;
  std::
  _Hashtable<void*,std::pair<void*const,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,void*>>>,std::allocator<std::pair<void*const,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,void*>>>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<char*,std::_Rb_tree_iterator<std::pair<unsigned_long_const,void*>>&>
            ((_Hashtable<void*,std::pair<void*const,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,void*>>>,std::allocator<std::pair<void*const,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,void*>>>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->chunks_free_end,&local_48,&it);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Arena::Arena(void *base_in, size_t size_in, size_t alignment_in):
    base(base_in), end(static_cast<char*>(base_in) + size_in), alignment(alignment_in)
{
    // Start with one free chunk that covers the entire arena
    auto it = size_to_free_chunk.emplace(size_in, base);
    chunks_free.emplace(base, it);
    chunks_free_end.emplace(static_cast<char*>(base) + size_in, it);
}